

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool LOADVerifyLibraryPath<char>(char *libraryPath)

{
  char *libraryPath_local;
  
  if (libraryPath == (char *)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0x7e);
    libraryPath_local._7_1_ = false;
  }
  else if (*libraryPath == '\0') {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0x57);
    libraryPath_local._7_1_ = false;
  }
  else {
    libraryPath_local._7_1_ = true;
  }
  return libraryPath_local._7_1_;
}

Assistant:

static bool LOADVerifyLibraryPath(const TChar *libraryPath)
{
    if (libraryPath == nullptr)
    {
        ERROR("libraryPath is null\n");
        SetLastError(ERROR_MOD_NOT_FOUND);
        return false;
    }
    if (libraryPath[0] == '\0')
    {
        ERROR("libraryPath is empty\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        return false;
    }
    return true;
}